

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

void Curl_getoff_all_pipelines(SessionHandle *data,connectdata *conn)

{
  curl_llist_element *pcVar1;
  int iVar2;
  SessionHandle *pSVar3;
  bool bVar4;
  bool bVar5;
  
  bVar5 = true;
  bVar4 = true;
  if (conn->readchannel_inuse == true) {
    pcVar1 = conn->recv_pipe->head;
    if (pcVar1 == (curl_llist_element *)0x0) {
      pSVar3 = (SessionHandle *)0x0;
    }
    else {
      pSVar3 = (SessionHandle *)pcVar1->ptr;
    }
    bVar4 = pSVar3 != data;
  }
  if (conn->writechannel_inuse == true) {
    pcVar1 = conn->send_pipe->head;
    if (pcVar1 == (curl_llist_element *)0x0) {
      pSVar3 = (SessionHandle *)0x0;
    }
    else {
      pSVar3 = (SessionHandle *)pcVar1->ptr;
    }
    bVar5 = pSVar3 != data;
  }
  iVar2 = Curl_removeHandleFromPipeline(data,conn->recv_pipe);
  if (!(bool)(iVar2 == 0 | bVar4)) {
    conn->readchannel_inuse = false;
  }
  iVar2 = Curl_removeHandleFromPipeline(data,conn->send_pipe);
  if (!(bool)(iVar2 == 0 | bVar5)) {
    conn->writechannel_inuse = false;
  }
  return;
}

Assistant:

void Curl_getoff_all_pipelines(struct SessionHandle *data,
                               struct connectdata *conn)
{
  bool recv_head = (conn->readchannel_inuse &&
    (gethandleathead(conn->recv_pipe) == data)) ? TRUE : FALSE;

  bool send_head = (conn->writechannel_inuse &&
    (gethandleathead(conn->send_pipe) == data)) ? TRUE : FALSE;

  if(Curl_removeHandleFromPipeline(data, conn->recv_pipe) && recv_head)
    conn->readchannel_inuse = FALSE;
  if(Curl_removeHandleFromPipeline(data, conn->send_pipe) && send_head)
    conn->writechannel_inuse = FALSE;
}